

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O0

int toknext(tokcxdef *ctx)

{
  byte bVar1;
  ushort uVar2;
  undefined2 uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint *puVar7;
  ushort **ppuVar8;
  char *pcVar9;
  tokdfdef *ptVar10;
  size_t sVar11;
  undefined8 *in_RDI;
  bool bVar12;
  tokscdef *sc;
  int warned;
  char *strstart;
  char delim;
  long acc;
  char mysym [39];
  int symlen;
  tokdfdef *df;
  uchar thischar;
  int found;
  toktdef *tab;
  char *q;
  int hash;
  int l;
  int len;
  tokdef *tok;
  char *p;
  undefined2 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2a;
  undefined1 in_stack_ffffffffffffff2b;
  undefined1 in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff2d;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff41;
  undefined1 in_stack_ffffffffffffff42;
  undefined1 in_stack_ffffffffffffff43;
  byte in_stack_ffffffffffffff44;
  undefined1 in_stack_ffffffffffffff45;
  undefined1 uVar13;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  uint in_stack_ffffffffffffff48;
  undefined1 uVar14;
  undefined1 in_stack_ffffffffffffff4d;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 uVar15;
  char *in_stack_ffffffffffffff50;
  undefined8 *puVar16;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  char *local_a0;
  undefined8 in_stack_ffffffffffffff70;
  long lVar17;
  tokcxdef *in_stack_ffffffffffffff78;
  int local_44;
  long local_40;
  undefined8 *local_38;
  uint local_2c;
  int local_28;
  uint local_24;
  char *local_18;
  
  puVar7 = (uint *)(in_RDI + 0x24);
  if ((*(uint *)((long)in_RDI + 0x11c) & 8) != 0) {
    *puVar7 = 0x35;
    *(uint *)((long)in_RDI + 0x11c) = *(uint *)((long)in_RDI + 0x11c) & 0xfffffff7;
    return *puVar7;
  }
  local_18 = (char *)in_RDI[0x34];
  local_24 = (uint)*(ushort *)(in_RDI + 0x35);
LAB_0011d165:
  do {
    if (local_24 == 0) {
      if (*(int *)(in_RDI + 0x23) == 0) {
        iVar4 = tokgetlin(in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20))
        ;
        if (iVar4 != 0) {
          *puVar7 = 1;
          goto LAB_0011ec94;
        }
        local_18 = (char *)in_RDI[0x34];
        uVar2 = *(ushort *)(in_RDI + 0x35);
      }
      else {
        *(int *)(in_RDI + 0x23) = *(int *)(in_RDI + 0x23) + -1;
        local_18 = (char *)in_RDI[(long)*(int *)(in_RDI + 0x23) + 10];
        uVar2 = *(ushort *)((long)in_RDI + (long)*(int *)(in_RDI + 0x23) * 2 + 0xf0);
      }
      local_24 = (uint)uVar2;
    }
    while( true ) {
      bVar12 = false;
      if ((local_24 != 0) &&
         (in_stack_ffffffffffffff4e = false, bVar12 = (bool)in_stack_ffffffffffffff4e,
         (byte)*local_18 < 0x80)) {
        ppuVar8 = __ctype_b_loc();
        in_stack_ffffffffffffff4e = ((*ppuVar8)[(int)(uint)(byte)*local_18] & 0x2000) != 0;
        bVar12 = (bool)in_stack_ffffffffffffff4e;
      }
      if (bVar12 == false) break;
      local_18 = local_18 + 1;
      local_24 = local_24 - 1;
    }
    if ((((int)local_24 < 2) || (*local_18 != 0x2f)) || (local_18[1] != 0x2f)) {
      if (((1 < (int)local_24) && (*local_18 == 0x2f)) && (local_18[1] == 0x2a)) {
        while( true ) {
          bVar12 = true;
          if ((1 < (int)local_24) && (bVar12 = true, *local_18 == 0x2a)) {
            bVar12 = local_18[1] != 0x2f;
          }
          if (!bVar12) break;
          if (local_24 != 0) {
            local_18 = local_18 + 1;
            local_24 = local_24 - 1;
          }
          if (local_24 == 0) {
            if (*(int *)(in_RDI + 0x23) == 0) {
              iVar4 = tokgetlin(in_stack_ffffffffffffff78,
                                (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
              if (iVar4 != 0) {
                in_RDI[0x34] = local_18;
                *puVar7 = 1;
                goto LAB_0011ec94;
              }
              local_18 = (char *)in_RDI[0x34];
              uVar2 = *(ushort *)(in_RDI + 0x35);
            }
            else {
              *(int *)(in_RDI + 0x23) = *(int *)(in_RDI + 0x23) + -1;
              local_18 = (char *)in_RDI[(long)*(int *)(in_RDI + 0x23) + 10];
              uVar2 = *(ushort *)((long)in_RDI + (long)*(int *)(in_RDI + 0x23) * 2 + 0xf0);
            }
            local_24 = (uint)uVar2;
          }
        }
        local_18 = local_18 + 2;
        local_24 = local_24 - 2;
        in_stack_ffffffffffffff4d = 0;
        goto LAB_0011d165;
      }
    }
    else {
      local_24 = 0;
    }
  } while (local_24 == 0);
  uVar15 = 0;
LAB_0011d4eb:
  while (((ppuVar8 = __ctype_b_loc(), ((*ppuVar8)[(int)(uint)(byte)*local_18] & 0x400) != 0 ||
          (*local_18 == 0x5f)) || (*local_18 == 0x24))) {
    local_44 = 0;
    local_2c = 0;
    local_28 = 0;
    local_38 = in_RDI + 0x27;
    while( true ) {
      uVar14 = false;
      if ((local_24 != 0) &&
         (((ppuVar8 = __ctype_b_loc(), ((*ppuVar8)[(int)(uint)(byte)*local_18] & 0x400) != 0 ||
           (ppuVar8 = __ctype_b_loc(), ((*ppuVar8)[(int)(uint)(byte)*local_18] & 0x800) != 0)) ||
          ((*local_18 == 0x5f || (uVar14 = false, *local_18 == 0x24)))))) {
        uVar14 = local_28 < 0x27;
      }
      if ((bool)uVar14 == false) break;
      ppuVar8 = __ctype_b_loc();
      if ((((*ppuVar8)[(int)(uint)(byte)*local_18] & 0x100) == 0) ||
         ((*(uint *)((long)in_RDI + 0x11c) & 2) == 0)) {
        in_stack_ffffffffffffff48 = (uint)*local_18;
      }
      else {
        in_stack_ffffffffffffff48 = tolower((uint)(byte)*local_18);
      }
      local_2c = local_2c + (in_stack_ffffffffffffff48 & 0xff) & 0xff;
      *(char *)local_38 = (char)in_stack_ffffffffffffff48;
      local_18 = local_18 + 1;
      local_24 = local_24 - 1;
      local_28 = local_28 + 1;
      local_38 = (undefined8 *)((long)local_38 + 1);
    }
    *(undefined1 *)local_38 = 0;
    if ((local_24 != 0) &&
       (((ppuVar8 = __ctype_b_loc(), ((*ppuVar8)[(int)(uint)(byte)*local_18] & 0x400) != 0 ||
         (ppuVar8 = __ctype_b_loc(), ((*ppuVar8)[(int)(uint)(byte)*local_18] & 0x800) != 0)) ||
        ((*local_18 == 0x5f || (*local_18 == 0x24)))))) {
      while( true ) {
        in_stack_ffffffffffffff47 = false;
        if (local_24 != 0) {
          ppuVar8 = __ctype_b_loc();
          in_stack_ffffffffffffff46 = true;
          in_stack_ffffffffffffff47 = in_stack_ffffffffffffff46;
          if (((*ppuVar8)[(int)(uint)(byte)*local_18] & 0x400) == 0) {
            ppuVar8 = __ctype_b_loc();
            in_stack_ffffffffffffff46 = true;
            in_stack_ffffffffffffff47 = in_stack_ffffffffffffff46;
            if ((((*ppuVar8)[(int)(uint)(byte)*local_18] & 0x800) == 0) &&
               (in_stack_ffffffffffffff46 = true,
               in_stack_ffffffffffffff47 = in_stack_ffffffffffffff46, *local_18 != 0x5f)) {
              in_stack_ffffffffffffff46 = *local_18 == 0x24;
              in_stack_ffffffffffffff47 = in_stack_ffffffffffffff46;
            }
          }
        }
        if ((bool)in_stack_ffffffffffffff47 == false) break;
        local_18 = local_18 + 1;
        local_24 = local_24 - 1;
      }
      pcVar9 = errstr((errcxdef *)
                      (ulong)CONCAT16(in_stack_ffffffffffffff46,
                                      CONCAT15(in_stack_ffffffffffffff45,
                                               CONCAT14(in_stack_ffffffffffffff44,
                                                        CONCAT13(in_stack_ffffffffffffff43,
                                                                 CONCAT12(in_stack_ffffffffffffff42,
                                                                          CONCAT11(
                                                  in_stack_ffffffffffffff41,
                                                  in_stack_ffffffffffffff40)))))),
                      in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
      *(char **)(*(long *)*in_RDI + 0x18) = pcVar9;
      *(undefined4 *)(*(long *)*in_RDI + 0x68) = 1;
      errlogn((errcxdef *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
              CONCAT13(in_stack_ffffffffffffff2f,
                       CONCAT12(in_stack_ffffffffffffff2e,
                                CONCAT11(in_stack_ffffffffffffff2d,in_stack_ffffffffffffff2c))),
              (char *)0x11d8ab);
    }
    *(int *)((long)in_RDI + 0x124) = local_28;
    *(uint *)((long)in_RDI + 0x134) = local_2c;
    if (local_28 == 9) {
      pcVar9 = "__DEFINED";
      if ((*(uint *)((long)in_RDI + 0x11c) & 2) != 0) {
        pcVar9 = "__defined";
      }
      iVar4 = memcmp(in_RDI + 0x27,pcVar9,9);
      if (((((iVar4 == 0) && (2 < (int)local_24)) && (*local_18 == 0x28)) &&
          (((ppuVar8 = __ctype_b_loc(), ((*ppuVar8)[(int)(uint)(byte)local_18[1]] & 0x400) != 0 ||
            (ppuVar8 = __ctype_b_loc(), ((*ppuVar8)[(int)(uint)(byte)local_18[1]] & 0x800) != 0)) ||
           ((local_18[1] == 0x5f || (local_18[1] == 0x24)))))) &&
         (ppuVar8 = __ctype_b_loc(), ((*ppuVar8)[(int)(uint)(byte)local_18[1]] & 0x800) == 0))
      goto LAB_0011da1d;
    }
    ptVar10 = tok_find_define((tokcxdef *)
                              CONCAT17(uVar15,CONCAT16(in_stack_ffffffffffffff4e,
                                                       CONCAT15(in_stack_ffffffffffffff4d,
                                                                CONCAT14(uVar14,
                                                  in_stack_ffffffffffffff48)))),
                              (char *)CONCAT17(in_stack_ffffffffffffff47,
                                               CONCAT16(in_stack_ffffffffffffff46,
                                                        CONCAT15(in_stack_ffffffffffffff45,
                                                                 CONCAT14(in_stack_ffffffffffffff44,
                                                                          CONCAT13(
                                                  in_stack_ffffffffffffff43,
                                                  CONCAT12(in_stack_ffffffffffffff42,
                                                           CONCAT11(in_stack_ffffffffffffff41,
                                                                    in_stack_ffffffffffffff40)))))))
                              ,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    if (ptVar10 == (tokdfdef *)0x0) {
      local_40 = in_RDI[5];
      while ((local_40 != 0 &&
             (local_44 = (**(code **)(local_40 + 8))
                                   (local_40,in_RDI + 0x27,local_28,local_2c,in_RDI + 0x2c),
             local_44 == 0))) {
        local_40 = *(long *)(local_40 + 0x20);
      }
      if ((local_44 == 0) || (*(char *)(in_RDI + 0x2c) != '\v')) {
        *puVar7 = 0x38;
        if (local_44 == 0) {
          *(undefined1 *)(in_RDI + 0x2c) = 0;
        }
      }
      else {
        *puVar7 = (uint)*(ushort *)((long)in_RDI + 0x162);
      }
      goto LAB_0011ec94;
    }
    if (0x13 < *(int *)(in_RDI + 0x23)) {
      errsigf((errcxdef *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
              (char *)CONCAT17(in_stack_ffffffffffffff2f,
                               CONCAT16(in_stack_ffffffffffffff2e,
                                        CONCAT15(in_stack_ffffffffffffff2d,
                                                 CONCAT14(in_stack_ffffffffffffff2c,
                                                          CONCAT13(in_stack_ffffffffffffff2b,
                                                                   CONCAT12(
                                                  in_stack_ffffffffffffff2a,
                                                  in_stack_ffffffffffffff28)))))),0);
    }
    in_RDI[(long)*(int *)(in_RDI + 0x23) + 10] = local_18;
    *(short *)((long)in_RDI + (long)*(int *)(in_RDI + 0x23) * 2 + 0xf0) = (short)local_24;
    *(int *)(in_RDI + 0x23) = *(int *)(in_RDI + 0x23) + 1;
    local_24 = ptVar10->explen;
    local_18 = ptVar10->expan;
  }
  ppuVar8 = __ctype_b_loc();
  if (((*ppuVar8)[(int)(uint)(byte)*local_18] & 0x800) == 0) {
    if ((*local_18 != 0x22) && (*local_18 != 0x27)) {
      if ((((int)local_24 < 2) || ((*local_18 != 0x3e || (local_18[1] != 0x3e)))) ||
         ((*(uint *)((long)in_RDI + 0x11c) & 1) == 0)) {
        puVar16 = (undefined8 *)
                  in_RDI[(ulong)*(byte *)((long)in_RDI + (ulong)(byte)*local_18 + 0x1aa) + 0xa0];
        while( true ) {
          if (puVar16 == (undefined8 *)0x0) {
            errsigf((errcxdef *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    (char *)CONCAT17(in_stack_ffffffffffffff2f,
                                     CONCAT16(in_stack_ffffffffffffff2e,
                                              CONCAT15(in_stack_ffffffffffffff2d,
                                                       CONCAT14(in_stack_ffffffffffffff2c,
                                                                CONCAT13(in_stack_ffffffffffffff2b,
                                                                         CONCAT12(
                                                  in_stack_ffffffffffffff2a,
                                                  in_stack_ffffffffffffff28)))))),0);
          }
          if ((*(int *)((long)puVar16 + 0xc) <= (int)local_24) &&
             ((*(int *)((long)puVar16 + 0xc) == 1 ||
              ((*(byte *)((long)puVar16 + 0x11) == local_18[1] &&
               ((*(int *)((long)puVar16 + 0xc) == 2 ||
                (*(byte *)((long)puVar16 + 0x12) == local_18[2])))))))) break;
          puVar16 = (undefined8 *)*puVar16;
        }
        *puVar7 = *(uint *)(puVar16 + 1);
        local_18 = local_18 + *(int *)((long)puVar16 + 0xc);
        local_24 = local_24 - *(int *)((long)puVar16 + 0xc);
        goto LAB_0011ec94;
      }
      *(uint *)((long)in_RDI + 0x11c) = *(uint *)((long)in_RDI + 0x11c) & 0xfffffffe;
      if (0x13 < *(int *)(in_RDI + 0x23)) {
        errsigf((errcxdef *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                (char *)CONCAT17(in_stack_ffffffffffffff2f,
                                 CONCAT16(in_stack_ffffffffffffff2e,
                                          CONCAT15(in_stack_ffffffffffffff2d,
                                                   CONCAT14(in_stack_ffffffffffffff2c,
                                                            CONCAT13(in_stack_ffffffffffffff2b,
                                                                     CONCAT12(
                                                  in_stack_ffffffffffffff2a,
                                                  in_stack_ffffffffffffff28)))))),0);
      }
      in_RDI[(long)*(int *)(in_RDI + 0x23) + 10] = local_18 + 2;
      *(short *)((long)in_RDI + (long)*(int *)(in_RDI + 0x23) * 2 + 0xf0) = (short)local_24 + -2;
      *(int *)(in_RDI + 0x23) = *(int *)(in_RDI + 0x23) + 1;
      if (local_18[2] == 0x22) {
        in_RDI[(long)(*(int *)(in_RDI + 0x23) + -1) + 10] =
             in_RDI[(long)(*(int *)(in_RDI + 0x23) + -1) + 10] + 1;
        *(short *)((long)in_RDI + (long)(*(int *)(in_RDI + 0x23) + -1) * 2 + 0xf0) =
             *(short *)((long)in_RDI + (long)(*(int *)(in_RDI + 0x23) + -1) * 2 + 0xf0) + -1;
        local_18 = tokmac3;
        *(uint *)((long)in_RDI + 0x11c) = *(uint *)((long)in_RDI + 0x11c) & 0xffffffef;
      }
      else {
        *(uint *)((long)in_RDI + 0x11c) = *(uint *)((long)in_RDI + 0x11c) | 0x10;
        local_18 = tokmac2;
      }
      sVar11 = strlen(local_18);
      local_24 = (uint)sVar11;
      goto LAB_0011d4eb;
    }
    bVar1 = *local_18;
    local_24 = local_24 - 1;
    local_a0 = local_18 + 1;
    if ((((bVar1 == 0x22) && (1 < (int)local_24)) && (*local_a0 == 0x3c)) && (local_18[2] == 0x3c))
    {
      if (0x13 < *(int *)(in_RDI + 0x23)) {
        errsigf((errcxdef *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                (char *)CONCAT17(in_stack_ffffffffffffff2f,
                                 CONCAT16(in_stack_ffffffffffffff2e,
                                          CONCAT15(in_stack_ffffffffffffff2d,
                                                   CONCAT14(in_stack_ffffffffffffff2c,
                                                            CONCAT13(in_stack_ffffffffffffff2b,
                                                                     CONCAT12(
                                                  in_stack_ffffffffffffff2a,
                                                  in_stack_ffffffffffffff28)))))),0);
      }
      in_RDI[(long)*(int *)(in_RDI + 0x23) + 10] = local_18 + 3;
      *(short *)((long)in_RDI + (long)*(int *)(in_RDI + 0x23) * 2 + 0xf0) = (short)local_24 + -2;
      *(int *)(in_RDI + 0x23) = *(int *)(in_RDI + 0x23) + 1;
      local_18 = tokmac1s;
      sVar11 = strlen(tokmac1s);
      local_24 = (uint)sVar11;
      *(uint *)((long)in_RDI + 0x11c) = *(uint *)((long)in_RDI + 0x11c) | 1;
      goto LAB_0011d4eb;
    }
    uVar5 = 0x36;
    if (bVar1 == 0x22) {
      uVar5 = 0x35;
    }
    *puVar7 = uVar5;
    uVar3 = (*(code *)in_RDI[7])(in_RDI[6]);
    *(undefined2 *)(in_RDI + 0x26) = uVar3;
    iVar4 = 0;
    local_18 = local_a0;
    while( true ) {
      while( true ) {
        for (; (1 < (int)local_24 && (*local_18 == 0x5c)); local_18 = local_18 + 2) {
          if ((local_18[1] == 0x22) || (local_18[1] == 0x27)) {
            (*(code *)in_RDI[8])(in_RDI[6],local_a0,(long)local_18 - (long)local_a0 & 0xffff);
            local_a0 = local_18 + 1;
          }
          local_24 = local_24 - 2;
        }
        if (((local_24 == 0) || (*local_18 == bVar1)) ||
           (((bVar1 == 0x22 &&
             (((1 < (int)local_24 && (*local_18 == 0x3c)) && (local_18[1] == 0x3c)))) &&
            ((*(uint *)((long)in_RDI + 0x11c) & 1) == 0)))) break;
        local_18 = local_18 + 1;
        local_24 = local_24 - 1;
      }
      (*(code *)in_RDI[8])(in_RDI[6],local_a0,(long)local_18 - (long)local_a0 & 0xffff);
      if (local_24 != 0) break;
      if (*(int *)(in_RDI + 0x23) == 0) {
        (*(code *)in_RDI[8])(in_RDI[6]," ",1);
      }
      else {
        *(int *)(in_RDI + 0x23) = *(int *)(in_RDI + 0x23) + -1;
        local_18 = (char *)in_RDI[(long)*(int *)(in_RDI + 0x23) + 10];
        local_24 = (uint)*(ushort *)((long)in_RDI + (long)*(int *)(in_RDI + 0x23) * 2 + 0xf0);
      }
      while (local_24 == 0) {
        iVar6 = tokgetlin(in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20))
        ;
        if (iVar6 != 0) {
          errsigf((errcxdef *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                  (char *)CONCAT17(in_stack_ffffffffffffff2f,
                                   CONCAT16(in_stack_ffffffffffffff2e,
                                            CONCAT15(in_stack_ffffffffffffff2d,
                                                     CONCAT14(in_stack_ffffffffffffff2c,
                                                              CONCAT13(in_stack_ffffffffffffff2b,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff2a,
                                                  in_stack_ffffffffffffff28)))))),0);
        }
        local_18 = (char *)in_RDI[0x34];
        local_24 = (uint)*(ushort *)(in_RDI + 0x35);
        if (((iVar4 == 0) && (local_24 != 0)) && ((*local_18 == 0x3b || (*local_18 == 0x7d)))) {
          errlogf((errcxdef *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                  (char *)CONCAT17(in_stack_ffffffffffffff2f,
                                   CONCAT16(in_stack_ffffffffffffff2e,
                                            CONCAT15(in_stack_ffffffffffffff2d,
                                                     CONCAT14(in_stack_ffffffffffffff2c,
                                                              CONCAT13(in_stack_ffffffffffffff2b,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff2a,
                                                  in_stack_ffffffffffffff28)))))),0);
          iVar4 = 1;
        }
        while( true ) {
          bVar12 = false;
          if ((local_24 != 0) &&
             (in_stack_ffffffffffffff2a = false, bVar12 = (bool)in_stack_ffffffffffffff2a,
             (byte)*local_18 < 0x80)) {
            ppuVar8 = __ctype_b_loc();
            in_stack_ffffffffffffff2a = ((*ppuVar8)[(int)(uint)(byte)*local_18] & 0x2000) != 0;
            bVar12 = (bool)in_stack_ffffffffffffff2a;
          }
          if (bVar12 == false) break;
          local_18 = local_18 + 1;
          local_24 = local_24 - 1;
        }
        in_stack_ffffffffffffff2b = 0;
      }
      local_a0 = local_18;
    }
    (*(code *)in_RDI[9])(in_RDI[6]);
    if ((local_24 == 0) || (*local_18 != bVar1)) {
      if ((local_24 != 0) && (*local_18 == 0x3c)) {
        if (0x13 < *(int *)(in_RDI + 0x23)) {
          errsigf((errcxdef *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                  (char *)CONCAT17(in_stack_ffffffffffffff2f,
                                   CONCAT16(in_stack_ffffffffffffff2e,
                                            CONCAT15(in_stack_ffffffffffffff2d,
                                                     CONCAT14(in_stack_ffffffffffffff2c,
                                                              CONCAT13(in_stack_ffffffffffffff2b,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff2a,
                                                  in_stack_ffffffffffffff28)))))),0);
        }
        in_RDI[(long)*(int *)(in_RDI + 0x23) + 10] = local_18 + 2;
        *(short *)((long)in_RDI + (long)*(int *)(in_RDI + 0x23) * 2 + 0xf0) = (short)local_24 + -2;
        *(int *)(in_RDI + 0x23) = *(int *)(in_RDI + 0x23) + 1;
        local_18 = tokmac1;
        sVar11 = strlen(tokmac1);
        local_24 = (uint)sVar11;
        *(uint *)((long)in_RDI + 0x11c) = *(uint *)((long)in_RDI + 0x11c) | 1;
        if ((*(uint *)((long)in_RDI + 0x11c) & 0x10) == 0) {
          *(uint *)((long)in_RDI + 0x11c) = *(uint *)((long)in_RDI + 0x11c) | 8;
          *puVar7 = 0x32;
        }
      }
    }
    else {
      local_18 = local_18 + 1;
      local_24 = local_24 - 1;
      if (((*(uint *)((long)in_RDI + 0x11c) & 0x10) != 0) &&
         ((*(uint *)((long)in_RDI + 0x11c) & 1) == 0)) {
        *(uint *)((long)in_RDI + 0x11c) = *(uint *)((long)in_RDI + 0x11c) & 0xffffffef;
        if (0x13 < *(int *)(in_RDI + 0x23)) {
          errsigf((errcxdef *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                  (char *)CONCAT17(in_stack_ffffffffffffff2f,
                                   CONCAT16(in_stack_ffffffffffffff2e,
                                            CONCAT15(in_stack_ffffffffffffff2d,
                                                     CONCAT14(in_stack_ffffffffffffff2c,
                                                              CONCAT13(in_stack_ffffffffffffff2b,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff2a,
                                                  in_stack_ffffffffffffff28)))))),0);
        }
        in_RDI[(long)*(int *)(in_RDI + 0x23) + 10] = local_18;
        *(short *)((long)in_RDI + (long)*(int *)(in_RDI + 0x23) * 2 + 0xf0) = (short)local_24;
        *(int *)(in_RDI + 0x23) = *(int *)(in_RDI + 0x23) + 1;
        local_18 = tokmac4;
        sVar11 = strlen(tokmac4);
        local_24 = (uint)sVar11;
      }
    }
  }
  else {
    lVar17 = 0;
    if (*local_18 == 0x30) {
      pcVar9 = local_18 + 1;
      uVar5 = local_24 - 1;
      if ((uVar5 == 0) || ((*pcVar9 != 0x78 && (*pcVar9 != 0x58)))) {
        while( true ) {
          local_18 = pcVar9;
          local_24 = uVar5;
          bVar12 = false;
          if (local_24 != 0) {
            ppuVar8 = __ctype_b_loc();
            bVar12 = false;
            if (((*ppuVar8)[(int)(uint)(byte)*local_18] & 0x800) != 0) {
              bVar12 = true;
              if (*local_18 != 0x38) {
                bVar12 = *local_18 == 0x39;
              }
              bVar12 = (bool)(bVar12 ^ 1);
            }
          }
          if (!bVar12) break;
          lVar17 = lVar17 * 8 + (long)(*local_18 + -0x30);
          uVar5 = local_24 - 1;
          pcVar9 = local_18 + 1;
        }
      }
      else {
        local_18 = local_18 + 2;
        local_24 = local_24 - 2;
        while( true ) {
          bVar12 = false;
          if (local_24 != 0) {
            ppuVar8 = __ctype_b_loc();
            bVar12 = true;
            if ((((*ppuVar8)[(int)(uint)(byte)*local_18] & 0x800) == 0) &&
               (((*local_18 < 'a' || (bVar12 = true, 'f' < *local_18)) &&
                (bVar12 = false, '@' < *local_18)))) {
              bVar12 = *local_18 < 'G';
            }
          }
          if (!bVar12) break;
          lVar17 = lVar17 << 4;
          ppuVar8 = __ctype_b_loc();
          if (((*ppuVar8)[(int)(uint)(byte)*local_18] & 0x800) == 0) {
            if (*local_18 < 'a') {
              iVar4 = *local_18 + -0x37;
            }
            else {
              iVar4 = *local_18 + -0x57;
            }
          }
          else {
            iVar4 = *local_18 + -0x30;
          }
          lVar17 = lVar17 + iVar4;
          local_18 = local_18 + 1;
          local_24 = local_24 - 1;
        }
      }
    }
    else {
      while( true ) {
        bVar12 = false;
        if (local_24 != 0) {
          ppuVar8 = __ctype_b_loc();
          bVar12 = ((*ppuVar8)[(int)(uint)(byte)*local_18] & 0x800) != 0;
        }
        if (!bVar12) break;
        lVar17 = lVar17 * 10 + (long)(*local_18 + -0x30);
        local_18 = local_18 + 1;
        local_24 = local_24 - 1;
      }
    }
    in_RDI[0x25] = lVar17;
    *puVar7 = 0x37;
  }
LAB_0011ec94:
  in_RDI[0x34] = local_18;
  *(short *)(in_RDI + 0x35) = (short)local_24;
  return *puVar7;
LAB_0011da1d:
  do {
    pcVar9 = local_18;
    uVar5 = local_24;
    local_18 = pcVar9 + 1;
    local_24 = uVar5 - 1;
    uVar13 = false;
    if ((local_24 != 0) && (uVar13 = false, *local_18 != 0x29)) {
      ppuVar8 = __ctype_b_loc();
      in_stack_ffffffffffffff44 = true;
      uVar13 = in_stack_ffffffffffffff44;
      if (((*ppuVar8)[(int)(uint)(byte)*local_18] & 0x400) == 0) {
        ppuVar8 = __ctype_b_loc();
        in_stack_ffffffffffffff44 = true;
        uVar13 = in_stack_ffffffffffffff44;
        if ((((*ppuVar8)[(int)(uint)(byte)*local_18] & 0x800) == 0) &&
           (in_stack_ffffffffffffff44 = true, uVar13 = in_stack_ffffffffffffff44, *local_18 != 0x5f)
           ) {
          in_stack_ffffffffffffff44 = *local_18 == 0x24;
          uVar13 = in_stack_ffffffffffffff44;
        }
      }
    }
    iVar4 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  } while ((bool)uVar13 != false);
  if ((local_24 == 0) || (*local_18 != 0x29)) {
    errsigf((errcxdef *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
            (char *)CONCAT17(in_stack_ffffffffffffff2f,
                             CONCAT16(in_stack_ffffffffffffff2e,
                                      CONCAT15(in_stack_ffffffffffffff2d,
                                               CONCAT14(in_stack_ffffffffffffff2c,
                                                        CONCAT13(in_stack_ffffffffffffff2b,
                                                                 CONCAT12(in_stack_ffffffffffffff2a,
                                                                          in_stack_ffffffffffffff28)
                                                                ))))),0);
  }
  local_18 = pcVar9 + 2;
  local_24 = uVar5 - 2;
  tok_casefold_defsym((tokcxdef *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                      in_stack_ffffffffffffff50,
                      (char *)CONCAT17(uVar15,CONCAT16(in_stack_ffffffffffffff4e,
                                                       CONCAT15(in_stack_ffffffffffffff4d,
                                                                CONCAT14(uVar14,
                                                  in_stack_ffffffffffffff48)))),
                      CONCAT13(in_stack_ffffffffffffff47,
                               CONCAT12(in_stack_ffffffffffffff46,(ushort)in_stack_ffffffffffffff44)
                              ));
  *puVar7 = 0x37;
  ptVar10 = tok_find_define((tokcxdef *)
                            CONCAT17(uVar15,CONCAT16(in_stack_ffffffffffffff4e,
                                                     CONCAT15(in_stack_ffffffffffffff4d,
                                                              CONCAT14(uVar14,
                                                  in_stack_ffffffffffffff48)))),
                            (char *)CONCAT17(in_stack_ffffffffffffff47,
                                             CONCAT16(in_stack_ffffffffffffff46,
                                                      CONCAT15(uVar13,CONCAT14(
                                                  in_stack_ffffffffffffff44,
                                                  CONCAT13(in_stack_ffffffffffffff43,
                                                           CONCAT12(in_stack_ffffffffffffff42,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff41,
                                                  in_stack_ffffffffffffff40))))))),iVar4);
  in_RDI[0x25] = (long)(int)(uint)(ptVar10 != (tokdfdef *)0x0);
  goto LAB_0011ec94;
}

Assistant:

int toknext(tokcxdef *ctx)
{
    char   *p;
    tokdef *tok = &ctx->tokcxcur;
    int     len;

    /* 
     *   Check for the special case that we pushed an open paren prior to
     *   a string containing an embedded expression.  If this is the case,
     *   immediately return the string we previously parsed. 
     */
    if ((ctx->tokcxflg & TOKCXF_EMBED_PAREN_PRE) != 0)
    {
        /* 
         *   convert the token to a string - note that the offset
         *   information for the string is already in the current token
         *   structure, since we set everything up for it on the previous
         *   call where we actually parsed the beginning of the string 
         */
        tok->toktyp = TOKTDSTRING;

        /* clear the special flag - we've now consumed the pushed string */
        ctx->tokcxflg &= ~TOKCXF_EMBED_PAREN_PRE;

        /* immediately return the string */
        return tok->toktyp;
    }

    /* set up at the current scanning position */
    p = ctx->tokcxptr;
    len = ctx->tokcxlen;

    /* scan off whitespace and comments until we find something */
    do
    {
    skipblanks:
        /* if there's nothing on this line, get the next one */
        if (len == 0)
        {
            /* if we're in a macro expansion, continue after it */
            if (ctx->tokcxmlvl)
            {
                ctx->tokcxmlvl--;
                p = ctx->tokcxmsav[ctx->tokcxmlvl];
                len = ctx->tokcxmsvl[ctx->tokcxmlvl];
            }
            else
            {
                if (tokgetlin(ctx, TRUE))
                {
                    tok->toktyp = TOKTEOF;
                    goto done;
                }
                p = ctx->tokcxptr;
                len = ctx->tokcxlen;
            }
        }
        while (len && t_isspace(*p)) ++p, --len;     /* scan off whitespace */
        
        /* check for comments, and remove if present */
        if (len >= 2 && *p == '/' && *(p+1) == '/')
            len = 0;
        else if (len >= 2 && *p == '/' && *(p+1) == '*')
        {
            while (len < 2 || *p != '*' || *(p+1) != '/')
            {
                if (len != 0)
                    ++p, --len;

                if (len == 0)
                {
                    if (ctx->tokcxmlvl != 0)
                    {
                        ctx->tokcxmlvl--;
                        p = ctx->tokcxmsav[ctx->tokcxmlvl];
                        len = ctx->tokcxmsvl[ctx->tokcxmlvl];
                    }
                    else
                    {
                        if (tokgetlin(ctx, FALSE))
                        {
                            ctx->tokcxptr = p;
                            tok->toktyp = TOKTEOF;
                            goto done;
                        }
                        p = ctx->tokcxptr;
                        len = ctx->tokcxlen;
                    }
                }
            }
            p += 2;
            len -= 2;
            goto skipblanks;
        }
    } while (len == 0);
    
nexttoken:
    if (isalpha((uchar)*p) || *p == '_' || *p == '$')
    {
        int       l;
        int       hash;
        char     *q;
        toktdef  *tab;
        int       found = FALSE;
        uchar     thischar;
        tokdfdef *df;
        
        for (hash = 0, l = 0, q = tok->toknam ;
             len != 0 && TOKISSYM(*p) && l < TOKNAMMAX ;
             (thischar = ((isupper((uchar)*p)
                           && (ctx->tokcxflg & TOKCXCASEFOLD))
                          ? tolower((uchar)*p) : *p)),
             (hash = ((hash + thischar) & (TOKHASHSIZE - 1))),
             (*q++ = thischar), ++p, --len, ++l) ;
        *q = '\0';
        if (len != 0 && TOKISSYM(*p))
        {
            while (len != 0 && TOKISSYM(*p)) ++p, --len;
            errlog1(ctx->tokcxerr, ERR_TRUNC, ERRTSTR,
                    errstr(ctx->tokcxerr, tok->toknam, tok->toklen));
        }
        tok->toklen = l;
        tok->tokhash = hash;

        /*
         *   check for the special defined() preprocessor operator 
         */
        if (l == 9 && !memcmp(tok->toknam,
                              ((ctx->tokcxflg & TOKCXCASEFOLD)
                               ? "__defined" : "__DEFINED"),
                              (size_t)9)
            && len > 2 && *p == '(' && TOKISSYM(*(p+1))
            && !isdigit((uchar)*(p+1)))
        {
            int symlen;
            char mysym[TOKNAMMAX];
            
            /* find the matching ')', allowing only symbolic characters */
            ++p, --len;
            for (symlen = 0, q = p ; len && *p != ')' && TOKISSYM(*p) ;
                 ++p, --len, ++symlen) ;

            /* make sure we found the closing paren */
            if (!len || *p != ')')
                errsig(ctx->tokcxerr, ERR_BADISDEF);
            ++p, --len;

            /* if we're folding case, convert the symbol to lower case */
            q = tok_casefold_defsym(ctx, mysym, q, symlen);

            /* check to see if it's defined */
            tok->toktyp = TOKTNUMBER;
            tok->tokval = (tok_find_define(ctx, q, symlen) != 0);
            goto done;
        }

        /* substitute the preprocessor #define, if any */
        if ((df = tok_find_define(ctx, tok->toknam, l)) != 0)
        {
            /* save the current parsing position */
            if (ctx->tokcxmlvl >= TOKMACNEST)
                errsig(ctx->tokcxerr, ERR_MACNEST);
            ctx->tokcxmsav[ctx->tokcxmlvl] = p;
            ctx->tokcxmsvl[ctx->tokcxmlvl] = len;
            ctx->tokcxmlvl++;

            /* point to the token's expansion and keep going */
            p = df->expan;
            len = df->explen;
            goto nexttoken;
        }
        
        /* look up in symbol table(s), if any */
        for (tab = ctx->tokcxstab ; tab ; tab = tab->toktnxt)
        {
            if ((found = (*tab->toktfsea)(tab, tok->toknam, l, hash,
                                          &tok->toksym)) != 0)
                break;
        }
        
        if (found && tok->toksym.tokstyp == TOKSTKW)
            tok->toktyp = tok->toksym.toksval;
        else
        {
            tok->toktyp = TOKTSYMBOL;
            if (!found) tok->toksym.tokstyp = TOKSTUNK;
        }
        goto done;
    }
    else if (isdigit((uchar)*p))
    {
        long acc = 0;
        
        /* check for octal/hex */
        if (*p == '0')
        {
            ++p, --len;
            if (len && (*p == 'x' || *p == 'X'))
            {
                /* hex */
                ++p, --len;
                while (len && TOKISHEX(*p))
                {
                    acc = (acc << 4) + TOKHEX2INT(*p);
                    ++p, --len;
                }
            }
            else
            {
                /* octal */
                while (len && TOKISOCT(*p))
                {
                    acc = (acc << 3) + TOKOCT2INT(*p);
                    ++p, --len;
                }
            }
        }
        else
        {
            /* decimal */
            while (len && isdigit((uchar)*p))
            {
                acc = (acc << 1) + (acc << 3) + TOKDEC2INT(*p);
                ++p, --len;
            }
        }
        tok->tokval = acc;
        tok->toktyp = TOKTNUMBER;
        goto done;
    }
    else if (*p == '"' || *p == '\'')
    {
        char  delim;                 /* closing delimiter we're looking for */
        char *strstart;                       /* pointer to start of string */
        int   warned;
        
        delim = *p;
        --len;
        strstart = ++p;

        if (delim == '"' && len >= 2 && *p == '<' && *(p+1) == '<')
        {
            /* save the current parsing position */
            if (ctx->tokcxmlvl >= TOKMACNEST)
                errsig(ctx->tokcxerr, ERR_MACNEST);
            ctx->tokcxmsav[ctx->tokcxmlvl] = p + 2;
            ctx->tokcxmsvl[ctx->tokcxmlvl] = len - 2;
            ctx->tokcxmlvl++;

            /* 
             *   read from the special "<<" expansion string - use the
             *   version for a "<<" at the very beginning of the string 
             */
            p = tokmac1s;
            len = strlen(p);
            ctx->tokcxflg |= TOKCXFINMAC;
            goto nexttoken;
        }
        tok->toktyp = (delim == '"' ? TOKTDSTRING : TOKTSSTRING);
        
        tok->tokofs = (*ctx->tokcxsst)(ctx->tokcxscx);  /* start the string */
        for (warned = FALSE ;; )
        {
            if (len >= 2 && *p == '\\')
            {
                if (*(p+1) == '"' || *(p+1) == '\'')
                {
                    (*ctx->tokcxsad)(ctx->tokcxscx, strstart,
                                     (ushort)(p - strstart));
                    strstart = p + 1;
                }
                p += 2;
                len -= 2;
            }
            else if (len == 0 || *p == delim ||
                     (delim == '"' && len >= 2 && *p == '<' && *(p+1) == '<'
                      && !(ctx->tokcxflg & TOKCXFINMAC)))
            {
                (*ctx->tokcxsad)(ctx->tokcxscx, strstart,
                                 (ushort)(p - strstart));
                if (len == 0)
                {
                    if (ctx->tokcxmlvl)
                    {
                        ctx->tokcxmlvl--;
                        p = ctx->tokcxmsav[ctx->tokcxmlvl];
                        len = ctx->tokcxmsvl[ctx->tokcxmlvl];
                    }
                    else
                        (*ctx->tokcxsad)(ctx->tokcxscx, " ", (ushort)1);
                    
                    while (len == 0)
                    {
                        if (tokgetlin(ctx, FALSE))
                            errsig(ctx->tokcxerr, ERR_STREOF);
                        p = ctx->tokcxptr;
                        len = ctx->tokcxlen;

                        /* warn if it looks like the end of an object */
                        if (!warned && len && (*p == ';' || *p == '}'))
                        {
                            errlog(ctx->tokcxerr, ERR_STREND);
                            warned = TRUE;     /* warn only once per string */
                        }

                        /* scan past whitespace at start of line */
                        while (len && t_isspace(*p)) ++p, --len;
                    }
                    strstart = p;
                }
                else break;
            }
            else
                ++p, --len;
        }

        /* end the string */
        (*ctx->tokcxsend)(ctx->tokcxscx);

        /* check to see how it ended */
        if (len != 0 && *p == delim)
        {
            /* 
             *   We ended with the matching delimiter.  Move past the
             *   closing delimiter. 
             */
            ++p;
            --len;

            /*
             *   If we have a pending close paren we need to put in
             *   because of an embedded expression that occurred earlier
             *   in the string, parse the macro to provide the paren.  
             */
            if ((ctx->tokcxflg & TOKCXF_EMBED_PAREN_AFT) != 0
                && !(ctx->tokcxflg & TOKCXFINMAC))
            {
                /* clear the flag */
                ctx->tokcxflg &= ~TOKCXF_EMBED_PAREN_AFT;

                /* push the current parsing position */
                if (ctx->tokcxmlvl >= TOKMACNEST)
                    errsig(ctx->tokcxerr, ERR_MACNEST);
                ctx->tokcxmsav[ctx->tokcxmlvl] = p;
                ctx->tokcxmsvl[ctx->tokcxmlvl] = len;
                ctx->tokcxmlvl++;

                /* parse the macro */
                p = tokmac4;
                len = strlen(p);
            }
        }
        else if (len != 0 && *p == '<')
        {
            /* save the current parsing position */
            if (ctx->tokcxmlvl >= TOKMACNEST)
                errsig(ctx->tokcxerr, ERR_MACNEST);
            ctx->tokcxmsav[ctx->tokcxmlvl] = p + 2;
            ctx->tokcxmsvl[ctx->tokcxmlvl] = len - 2;
            ctx->tokcxmlvl++;

            /* read from the "<<" expansion */
            p = tokmac1;
            len = strlen(p);
            ctx->tokcxflg |= TOKCXFINMAC;

            /* 
             *   Set the special push-a-paren flag: we'll return an open
             *   paren now, so that we have an open paren before the
             *   string, and then on the next call to toknext() we'll
             *   immediately return the string we've already parsed here.
             *   This will ensure that everything in the string is
             *   properly grouped together as a single indivisible
             *   expression.
             *   
             *   Note that we only need to do this for the first embedded
             *   expression in a string.  Once we have a close paren
             *   pending, we don't need more open parens.  
             */
            if (!(ctx->tokcxflg & TOKCXF_EMBED_PAREN_AFT))
            {
                ctx->tokcxflg |= TOKCXF_EMBED_PAREN_PRE;
                tok->toktyp = TOKTLPAR;
            }
        }
        goto done;
    }
    else if (len >= 2 && *p == '>' && *(p+1) == '>'
             && (ctx->tokcxflg & TOKCXFINMAC) != 0)
    {
        /* skip the ">>" */
        ctx->tokcxflg &= ~TOKCXFINMAC;
        p += 2;
        len -= 2;

        /* save the current parsing position */
        if (ctx->tokcxmlvl >= TOKMACNEST)
            errsig(ctx->tokcxerr, ERR_MACNEST);
        ctx->tokcxmsav[ctx->tokcxmlvl] = p;
        ctx->tokcxmsvl[ctx->tokcxmlvl] = len;
        ctx->tokcxmlvl++;

        if (*p == '"')
        {
            ++(ctx->tokcxmsav[ctx->tokcxmlvl - 1]);
            --(ctx->tokcxmsvl[ctx->tokcxmlvl - 1]);
            p = tokmac3;

            /* 
             *   we won't need an extra closing paren now, since tokmac3
             *   provides it 
             */
            ctx->tokcxflg &= ~TOKCXF_EMBED_PAREN_AFT;
        }
        else
        {
            /* 
             *   The string is continuing.  Set a flag to note that we
             *   need to provide a close paren after the end of the
             *   string, and parse the glue (tokmac2) that goes between
             *   the expression and the resumption of the string. 
             */
            ctx->tokcxflg |= TOKCXF_EMBED_PAREN_AFT;
            p = tokmac2;
        }

        len = strlen(p);
        goto nexttoken;
    }
    else
    {
        tokscdef *sc;
        
        for (sc = ctx->tokcxsc[ctx->tokcxinx[(uchar)*p]] ; sc ;
             sc = sc->tokscnxt)
        {
            if (toksceq(sc->tokscstr, p, sc->toksclen, len))
            {
                tok->toktyp = sc->toksctyp;
                p += sc->toksclen;
                len -= sc->toksclen;
                goto done;
            }
        }
        errsig(ctx->tokcxerr, ERR_INVTOK);
    }
    
done:
    ctx->tokcxptr = p;
    ctx->tokcxlen = len;
    return(tok->toktyp);
}